

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O2

void av1_lowbd_fwd_txfm2d_16x8_sse2
               (int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  code *pcVar1;
  code *pcVar2;
  int8_t *piVar3;
  undefined7 in_register_00000009;
  ulong uVar4;
  long lVar5;
  __m128i *out;
  __m128i buf1 [16];
  __m128i buf0 [16];
  
  piVar3 = av1_fwd_txfm_shift_ls[8];
  uVar4 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  pcVar1 = *(code **)((long)col_txfm8x8_arr + uVar4);
  pcVar2 = *(code **)((long)row_txfm8x16_arr + uVar4);
  out = buf0;
  for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 0x80) {
    if ((0xbeafU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
      load_buffer_16bit_to_16bit_flip(input,stride,out,8);
    }
    else {
      load_buffer_16bit_to_16bit(input,stride,out,8);
    }
    round_shift_16bit(out,8,(int)*piVar3);
    (*pcVar1)(out,out,0xd);
    round_shift_16bit(out,8,(int)piVar3[1]);
    transpose_16bit_8x8(out,(__m128i *)((long)buf1[0] + lVar5));
    input = input + 8;
  }
  if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
    flip_buf_sse2(buf1,out,0x10);
  }
  else {
    out = buf1;
  }
  (*pcVar2)(out,out,0xd);
  round_shift_16bit(out,0x10,(int)piVar3[2]);
  store_rect_buffer_16bit_to_32bit_w8(out,output,8,0x10);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_16x8_sse2(const int16_t *input, int32_t *output,
                                    int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[16], buf1[16];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X8];
  const int txw_idx = get_txw_idx(TX_16X8);
  const int txh_idx = get_txh_idx(TX_16X8);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 16;
  const int height = 8;
  const transform_1d_sse2 col_txfm = col_txfm8x8_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm8x16_arr[tx_type];
  __m128i *buf;
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  for (int i = 0; i < 2; i++) {
    if (ud_flip) {
      load_buffer_16bit_to_16bit_flip(input + 8 * i, stride, buf0, height);
    } else {
      load_buffer_16bit_to_16bit(input + 8 * i, stride, buf0, height);
    }
    round_shift_16bit(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit(buf0, height, shift[1]);
    transpose_16bit_8x8(buf0, buf1 + 8 * i);
  }

  if (lr_flip) {
    buf = buf0;
    flip_buf_sse2(buf1, buf, width);
  } else {
    buf = buf1;
  }
  row_txfm(buf, buf, cos_bit_row);
  round_shift_16bit(buf, width, shift[2]);
  store_rect_buffer_16bit_to_32bit_w8(buf, output, height, width);
}